

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O1

uint32_t leveldb::crc32c::Extend(uint32_t crc,char *data,size_t n)

{
  uint uVar1;
  long lVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  uint *puVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint *puVar16;
  uint uVar17;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((Extend(unsigned_int,char_const*,unsigned_long)::accelerate == '\0') &&
     (iVar5 = __cxa_guard_acquire(), iVar5 != 0)) {
    uVar3 = ::crc32c::Extend(0,(uint8_t *)"TestCRCBuffer",0xd);
    Extend::accelerate = uVar3 == 0xdcbc59fa;
    __cxa_guard_release(&Extend(unsigned_int,char_const*,unsigned_long)::accelerate);
  }
  if (Extend::accelerate == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      uVar3 = ::crc32c::Extend(crc,(uint8_t *)data,n);
      return uVar3;
    }
  }
  else {
    puVar16 = (uint *)(data + n);
    uVar17 = ~crc;
    puVar6 = (uint *)((ulong)(data + 3) & 0xfffffffffffffffc);
    puVar11 = (uint *)data;
    if ((long)puVar6 - (long)data != 0 && puVar6 <= puVar16) {
      do {
        puVar12 = (uint *)((long)puVar11 + 1);
        uVar17 = uVar17 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable +
                          (ulong)((uint)(byte)*puVar11 ^ uVar17 & 0xff) * 4);
        puVar11 = puVar12;
      } while (puVar12 != puVar6);
      data = data + ((long)puVar6 - (long)data);
    }
    if (0xf < (long)puVar16 - (long)data) {
      uVar17 = uVar17 ^ *(uint *)data;
      uVar4 = *(uint *)((long)data + 4);
      uVar7 = *(uint *)((long)data + 8);
      uVar8 = *(uint *)((long)data + 0xc);
      data = (char *)((long)data + 0x10);
      for (lVar13 = (long)puVar16 - (long)data; 0xf < lVar13; lVar13 = lVar13 + -0x10) {
        uVar17 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 +
                          (ulong)(uVar17 & 0xff) * 4) ^ *(uint *)data ^
                 *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                          (ulong)(uVar17 >> 8 & 0xff) * 4) ^
                 *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar17 >> 0xe & 0x3fc))
                 ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable0 +
                            (ulong)(uVar17 >> 0x18) * 4);
        uVar4 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar4 & 0xff) * 4)
                ^ *(uint *)((long)data + 4) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                         (ulong)(uVar4 >> 8 & 0xff) * 4) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar4 >> 0xe & 0x3fc)) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar4 >> 0x18) * 4
                         );
        uVar7 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar7 & 0xff) * 4)
                ^ *(uint *)((long)data + 8) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                         (ulong)(uVar7 >> 8 & 0xff) * 4) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar7 >> 0xe & 0x3fc)) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar7 >> 0x18) * 4
                         );
        uVar8 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar8 & 0xff) * 4)
                ^ *(uint *)((long)data + 0xc) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                         (ulong)(uVar8 >> 8 & 0xff) * 4) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar8 >> 0xe & 0x3fc)) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar8 >> 0x18) * 4
                         );
        data = (char *)((long)data + 0x10);
      }
      for (lVar13 = (long)puVar16 - (long)data; 3 < lVar13; lVar13 = lVar13 + -4) {
        uVar9 = uVar17 & 0xff;
        uVar1 = *(uint *)data;
        uVar14 = uVar17 >> 8;
        uVar15 = uVar17 >> 0xe;
        uVar10 = uVar17 >> 0x18;
        data = (char *)((long)data + 4);
        uVar17 = uVar4;
        uVar4 = uVar7;
        uVar7 = uVar8;
        uVar8 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)uVar9 * 4) ^ uVar1
                ^ *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                           (ulong)(uVar14 & 0xff) * 4) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar15 & 0x3fc)) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)uVar10 * 4);
      }
      lVar13 = 4;
      do {
        uVar17 = uVar17 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable + ((ulong)uVar17 & 0xff) * 4);
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      uVar17 = uVar17 ^ uVar4;
      lVar13 = 4;
      do {
        uVar17 = uVar17 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar17 & 0xff) * 4);
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      uVar17 = uVar17 ^ uVar7;
      lVar13 = 4;
      do {
        uVar17 = uVar17 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar17 & 0xff) * 4);
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      uVar17 = uVar17 ^ uVar8;
      lVar13 = 4;
      do {
        uVar17 = uVar17 >> 8 ^
                 *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar17 & 0xff) * 4);
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    for (; (uint *)data != puVar16; data = (char *)((long)data + 1)) {
      uVar17 = uVar17 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable +
                        (ulong)((uint)(byte)*(uint *)data ^ uVar17 & 0xff) * 4);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return ~uVar17;
    }
  }
  __stack_chk_fail();
}

Assistant:

uint32_t Extend(uint32_t crc, const char* data, size_t n) {
  static bool accelerate = CanAccelerateCRC32C();
  if (accelerate) {
    return port::AcceleratedCRC32C(crc, data, n);
  }

  const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
  const uint8_t* e = p + n;
  uint32_t l = crc ^ kCRC32Xor;

// Process one byte at a time.
#define STEP1                              \
  do {                                     \
    int c = (l & 0xff) ^ *p++;             \
    l = kByteExtensionTable[c] ^ (l >> 8); \
  } while (0)

// Process one of the 4 strides of 4-byte data.
#define STEP4(s)                                                               \
  do {                                                                         \
    crc##s = ReadUint32LE(p + s * 4) ^ kStrideExtensionTable3[crc##s & 0xff] ^ \
             kStrideExtensionTable2[(crc##s >> 8) & 0xff] ^                    \
             kStrideExtensionTable1[(crc##s >> 16) & 0xff] ^                   \
             kStrideExtensionTable0[crc##s >> 24];                             \
  } while (0)

// Process a 16-byte swath of 4 strides, each of which has 4 bytes of data.
#define STEP16 \
  do {         \
    STEP4(0);  \
    STEP4(1);  \
    STEP4(2);  \
    STEP4(3);  \
    p += 16;   \
  } while (0)

// Process 4 bytes that were already loaded into a word.
#define STEP4W(w)                                   \
  do {                                              \
    w ^= l;                                         \
    for (size_t i = 0; i < 4; ++i) {                \
      w = (w >> 8) ^ kByteExtensionTable[w & 0xff]; \
    }                                               \
    l = w;                                          \
  } while (0)

  // Point x at first 4-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<4>(p);
  if (x <= e) {
    // Process bytes p is 4-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  if ((e - p) >= 16) {
    // Load a 16-byte swath into the stride partial results.
    uint32_t crc0 = ReadUint32LE(p + 0 * 4) ^ l;
    uint32_t crc1 = ReadUint32LE(p + 1 * 4);
    uint32_t crc2 = ReadUint32LE(p + 2 * 4);
    uint32_t crc3 = ReadUint32LE(p + 3 * 4);
    p += 16;

    // It is possible to get better speeds (at least on x86) by interleaving
    // prefetching 256 bytes ahead with processing 64 bytes at a time. See the
    // portable implementation in https://github.com/google/crc32c/.

    // Process one 16-byte swath at a time.
    while ((e - p) >= 16) {
      STEP16;
    }

    // Advance one word at a time as far as possible.
    while ((e - p) >= 4) {
      STEP4(0);
      uint32_t tmp = crc0;
      crc0 = crc1;
      crc1 = crc2;
      crc2 = crc3;
      crc3 = tmp;
      p += 4;
    }

    // Combine the 4 partial stride results.
    l = 0;
    STEP4W(crc0);
    STEP4W(crc1);
    STEP4W(crc2);
    STEP4W(crc3);
  }

  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef STEP4W
#undef STEP16
#undef STEP4
#undef STEP1
  return l ^ kCRC32Xor;
}